

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O1

tuple<Move,_unsigned_long,_unsigned_long> * __thiscall
Controller::makeMove
          (tuple<Move,_unsigned_long,_unsigned_long> *__return_storage_ptr__,Controller *this,
          uint tilePosition)

{
  Move move;
  ulong col;
  ulong row;
  
  row = (ulong)tilePosition / 10;
  col = (ulong)(tilePosition % 10);
  move = Board::checkMove((this->board)._M_t.
                          super___uniq_ptr_impl<Board,_std::default_delete<Board>_>._M_t.
                          super__Tuple_impl<0UL,_Board_*,_std::default_delete<Board>_>.
                          super__Head_base<0UL,_Board_*,_false>._M_head_impl,row,col);
  if (move == NOT_ALLOWED) {
    (__return_storage_ptr__->super__Tuple_impl<0UL,_Move,_unsigned_long,_unsigned_long>).
    super__Tuple_impl<1UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<2UL,_unsigned_long>.
    super__Head_base<2UL,_unsigned_long,_false>._M_head_impl = 0;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_Move,_unsigned_long,_unsigned_long>).
    super__Tuple_impl<1UL,_unsigned_long,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>
    ._M_head_impl = 0;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_Move,_unsigned_long,_unsigned_long>).
    super__Head_base<0UL,_Move,_false>._M_head_impl = NOT_ALLOWED;
  }
  else {
    UndoMove::PutMove((this->undoMoveService)._M_t.
                      super___uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_>._M_t.
                      super__Tuple_impl<0UL,_UndoMove_*,_std::default_delete<UndoMove>_>.
                      super__Head_base<0UL,_UndoMove_*,_false>._M_head_impl,move,row,col);
    (__return_storage_ptr__->super__Tuple_impl<0UL,_Move,_unsigned_long,_unsigned_long>).
    super__Tuple_impl<1UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<2UL,_unsigned_long>.
    super__Head_base<2UL,_unsigned_long,_false>._M_head_impl = col;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_Move,_unsigned_long,_unsigned_long>).
    super__Tuple_impl<1UL,_unsigned_long,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>
    ._M_head_impl = row;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_Move,_unsigned_long,_unsigned_long>).
    super__Head_base<0UL,_Move,_false>._M_head_impl = move;
  }
  return __return_storage_ptr__;
}

Assistant:

std::tuple<Move, size_t, size_t> Controller::makeMove( uint tilePosition )
{
    uint row = tilePosition / 10;
    uint col = tilePosition % 10;
    Move move = board->checkMove( row, col );
    if ( move == Move::NOT_ALLOWED )
    {
        return { Move::NOT_ALLOWED, 0, 0 };
    }

    undoMoveService->PutMove( move, row, col );
    return { move, row, col };
}